

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aead128a_enc.c
# Opt level: O0

void test_aead128a_encryption(void)

{
  puts("Testing Ascon-128a encryption...");
  test_aead_cleanup();
  test_encrypt_empty();
  test_encrypt_1_byte_ad_empty_pt();
  test_encrypt_1_byte_pt_empty_ad();
  test_encrypt_1_byte_pt_1_byte_ad();
  test_encrypt_offline();
  test_encrypt_update_single_byte();
  test_encrypt_update_three_bytes();
  test_encrypt_update_var_bytes();
  return;
}

Assistant:

void test_aead128a_encryption(void)
{
    puts("Testing Ascon-128a encryption...");
    test_aead_cleanup();
    test_encrypt_empty();
    test_encrypt_1_byte_ad_empty_pt();
    test_encrypt_1_byte_pt_empty_ad();
    test_encrypt_1_byte_pt_1_byte_ad();
    test_encrypt_offline();
    test_encrypt_update_single_byte();
    test_encrypt_update_three_bytes();
    test_encrypt_update_var_bytes();
}